

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

double ex_dofact(int i)

{
  float fVar1;
  
  if (0 < i) {
    fVar1 = 1.0;
    do {
      fVar1 = fVar1 * (float)i;
      i = i + -1;
    } while (i != 0);
    return (double)fVar1;
  }
  return 1.0;
}

Assistant:

static double
ex_dofact(int i)
{
        float ret = 0;

        if (i > 0)
                ret = 1;
        else
                return (1);

        do {
                ret *= i;
        } while (--i);

        return(ret);
}